

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarimage.hpp
# Opt level: O2

void __thiscall ScalarImage::ScalarImage(ScalarImage *this,string *filename)

{
  bool bVar1;
  float *retval_from_stbi_load;
  float *pfVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int n;
  string ext;
  
  suffix(&ext,filename);
  github111116::ConsoleLogger::log<char[21],std::__cxx11::string>
            (&console,(char (*) [21])"Loading ScalarImage:",filename);
  bVar1 = std::operator==(&ext,"hdr");
  if (((!bVar1) && (bVar1 = std::operator==(&ext,"png"), !bVar1)) &&
     (bVar1 = std::operator==(&ext,"jpg"), !bVar1)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "ScalarImage load: unrecognized format";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  retval_from_stbi_load = stbi_loadf((filename->_M_dataplus)._M_p,&this->w,&this->h,&n,0);
  if (retval_from_stbi_load == (float *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "ScalarImage load failed";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  uVar7 = (long)this->h * (long)this->w;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)uVar7) {
    uVar4 = uVar7 * 4;
  }
  pfVar2 = (float *)operator_new__(uVar4);
  this->pixels = pfVar2;
  uVar4 = 0;
  uVar5 = 0;
  iVar6 = n;
  if (0 < (int)uVar7) {
    uVar5 = uVar7 & 0xffffffff;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pfVar2[uVar4] = retval_from_stbi_load[(long)iVar6 + -1];
    iVar6 = iVar6 + n;
  }
  stbi_image_free(retval_from_stbi_load);
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

ScalarImage(const std::string& filename)
	{
		std::string ext = suffix(filename);
		console.log("Loading ScalarImage:", filename);
		if (ext == "hdr" || ext == "png" || ext == "jpg") {
			// use the last channel
			int n;
			float* raw = stbi_loadf(filename.c_str(), &w, &h, &n, 0);
			if (raw == NULL) throw "ScalarImage load failed";
			pixels = new float[w*h];
			for (int i=0; i<w*h; ++i)
				pixels[i] = raw[i*n+n-1];
			stbi_image_free(raw);
			return;
		}
		throw "ScalarImage load: unrecognized format";
	}